

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

double ov_time_tell(OggVorbis_File *vf)

{
  double dVar1;
  double local_30;
  double time_total;
  ogg_int64_t pcm_total;
  int link;
  OggVorbis_File *vf_local;
  
  pcm_total._4_4_ = 0;
  time_total = 0.0;
  local_30 = 0.0;
  if (vf->ready_state < 2) {
    vf_local = (OggVorbis_File *)0xc060600000000000;
  }
  else {
    if (vf->seekable != 0) {
      time_total = (double)ov_pcm_total(vf,-1);
      local_30 = ov_time_total(vf,-1);
      pcm_total._4_4_ = vf->links;
      do {
        pcm_total._4_4_ = pcm_total._4_4_ + -1;
        if (pcm_total._4_4_ < 0) break;
        time_total = (double)((long)time_total - vf->pcmlengths[pcm_total._4_4_ * 2 + 1]);
        dVar1 = ov_time_total(vf,pcm_total._4_4_);
        local_30 = local_30 - dVar1;
      } while (vf->pcm_offset < (long)time_total);
    }
    vf_local = (OggVorbis_File *)
               (local_30 +
               (double)(vf->pcm_offset - (long)time_total) / (double)vf->vi[pcm_total._4_4_].rate);
  }
  return (double)vf_local;
}

Assistant:

double ov_time_tell(OggVorbis_File *vf){
  int link=0;
  ogg_int64_t pcm_total=0;
  double time_total=0.f;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(vf->seekable){
    pcm_total=ov_pcm_total(vf,-1);
    time_total=ov_time_total(vf,-1);

    /* which bitstream section does this time offset occur in? */
    for(link=vf->links-1;link>=0;link--){
      pcm_total-=vf->pcmlengths[link*2+1];
      time_total-=ov_time_total(vf,link);
      if(vf->pcm_offset>=pcm_total)break;
    }
  }

  return((double)time_total+(double)(vf->pcm_offset-pcm_total)/vf->vi[link].rate);
}